

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan.h
# Opt level: O2

Orphan<capnp::Text> * __thiscall
capnp::Orphanage::newOrphanCopy<capnp::Text::Reader>
          (Orphan<capnp::Text> *__return_storage_ptr__,Orphanage *this,Reader copyFrom)

{
  OrphanBuilder local_30;
  
  _::OrphanBuilder::copy((EVP_PKEY_CTX *)&local_30,(EVP_PKEY_CTX *)this->arena);
  (__return_storage_ptr__->builder).segment = local_30.segment;
  (__return_storage_ptr__->builder).capTable = local_30.capTable;
  (__return_storage_ptr__->builder).location = local_30.location;
  local_30.segment = (SegmentBuilder *)0x0;
  (__return_storage_ptr__->builder).tag.content = local_30.tag.content;
  local_30.location = (word *)0x0;
  _::OrphanBuilder::~OrphanBuilder(&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline Orphan<FromReader<Reader>> Orphanage::newOrphanCopy(Reader copyFrom) const {
  return Orphan<FromReader<Reader>>(_::OrphanBuilder::copy(
      arena, capTable, GetInnerReader<FromReader<Reader>>::apply(copyFrom)));
}